

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t scratch_seq_skip(_internal_exr_seq_scratch *scr,uint64_t sz)

{
  ulong uVar1;
  int64_t iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int64_t nread;
  int64_t local_38;
  
  if (sz == 0) {
    iVar3 = -1;
    uVar7 = 0;
  }
  else {
    iVar3 = -1;
    uVar7 = 0;
    uVar6 = sz;
    do {
      uVar1 = scr->navail;
      if ((long)uVar1 < 1) {
        local_38 = 0;
        iVar3 = (*scr->ctxt->do_read)
                          (scr->ctxt,scr->scratch,0x1000,&scr->fileoff,&local_38,
                           EXR_ALLOW_SHORT_READ);
        iVar2 = local_38;
        if (local_38 < 1) {
          if (local_38 == 0) {
            iVar3 = (*scr->ctxt->report_error)(scr->ctxt,10,"End of file attempting to read header")
            ;
          }
        }
        else {
          scr->navail = local_38;
          scr->curpos = 0;
        }
        if (iVar2 < 1) break;
      }
      else {
        uVar5 = uVar1;
        if (uVar6 < uVar1) {
          uVar5 = uVar6;
        }
        scr->curpos = scr->curpos + uVar5;
        scr->navail = uVar1 - uVar5;
        uVar6 = uVar6 - uVar5;
        uVar7 = uVar7 + uVar5;
      }
    } while (uVar6 != 0);
  }
  iVar4 = 10;
  if (uVar7 == sz) {
    iVar4 = 0;
  }
  if (iVar3 != -1) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

static exr_result_t
scratch_seq_skip (struct _internal_exr_seq_scratch* scr, uint64_t sz)
{
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            nCopied += nCopy;
        }
        else
        {
            int64_t nread = 0;
            rv            = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                SCRATCH_BUFFER_SIZE,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}